

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemFilter.h
# Opt level: O3

IOStream * __thiscall Assimp::FileSystemFilter::Open(FileSystemFilter *this,char *pFile,char *pMode)

{
  IOSystem *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string tmp;
  allocator<char> local_71;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  IOStream *pIVar3;
  
  pIVar1 = this->mWrapped;
  if (pIVar1 != (IOSystem *)0x0) {
    if (pMode == (char *)0x0 || pFile == (char *)0x0) {
      pIVar3 = (IOStream *)0x0;
    }
    else {
      iVar2 = (*pIVar1->_vptr_IOSystem[4])(pIVar1,pFile,pMode);
      pIVar3 = (IOStream *)CONCAT44(extraout_var,iVar2);
      if (pIVar3 == (IOStream *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,pFile,(allocator<char> *)local_70);
        BuildPath(this,&local_50);
        pIVar1 = this->mWrapped;
        std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pMode,&local_71);
        iVar2 = (*pIVar1->_vptr_IOSystem[4])(pIVar1,local_50._M_dataplus._M_p,local_70[0]);
        pIVar3 = (IOStream *)CONCAT44(extraout_var_00,iVar2);
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        if (pIVar3 == (IOStream *)0x0) {
          strlen(pFile);
          std::__cxx11::string::_M_replace
                    ((ulong)&local_50,0,(char *)local_50._M_string_length,(ulong)pFile);
          Cleanup(this,&local_50);
          BuildPath(this,&local_50);
          pIVar1 = this->mWrapped;
          std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pMode,&local_71);
          iVar2 = (*pIVar1->_vptr_IOSystem[4])(pIVar1,local_50._M_dataplus._M_p,local_70[0]);
          pIVar3 = (IOStream *)CONCAT44(extraout_var_01,iVar2);
          if (local_70[0] != local_60) {
            operator_delete(local_70[0],local_60[0] + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    }
    return pIVar3;
  }
  __assert_fail("nullptr != mWrapped",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/FileSystemFilter.h"
                ,0x7d,"virtual IOStream *Assimp::FileSystemFilter::Open(const char *, const char *)"
               );
}

Assistant:

IOStream* Open( const char* pFile, const char* pMode = "rb") {
        ai_assert( nullptr != mWrapped );
        if ( nullptr == pFile || nullptr == pMode ) {
            return nullptr;
        }
        
        ai_assert( nullptr != pFile );
        ai_assert( nullptr != pMode );

        // First try the unchanged path
        IOStream* s = mWrapped->Open(pFile,pMode);

        if (nullptr == s) {
            std::string tmp = pFile;

            // Try to convert between absolute and relative paths
            BuildPath(tmp);
            s = mWrapped->Open(tmp,pMode);

            if (nullptr == s) {
                // Finally, look for typical issues with paths
                // and try to correct them. This is our last
                // resort.
                tmp = pFile;
                Cleanup(tmp);
                BuildPath(tmp);
                s = mWrapped->Open(tmp,pMode);
            }
        }

        return s;
    }